

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

boolean load_special(level *lev,char *name)

{
  byte bVar1;
  uint uVar2;
  opvar *ov;
  boolean bVar3;
  int iVar4;
  int iVar5;
  dlb *dp;
  byte *buf;
  void *buf_00;
  long lVar6;
  long lVar7;
  long lVar8;
  sp_lev lvl;
  version_info vers_info;
  int local_64;
  sp_lev local_60;
  void *local_50;
  level *local_48;
  version_info local_3c;
  
  dp = dlb_fopen(name,"r");
  if (dp != (dlb *)0x0) {
    iVar4 = dlb_fread(&local_3c,0xc,1,dp);
    if (iVar4 == 1) {
      bVar3 = check_version(&local_3c,name,'\x01');
      if (bVar3 == '\0') {
        bVar3 = '\0';
      }
      else {
        local_48 = lev;
        iVar4 = dlb_fread(&local_60.n_opcodes,1,8,dp);
        lVar6 = local_60.n_opcodes;
        if (iVar4 == 8) {
          local_60.opcodes = (_opcode *)malloc(local_60.n_opcodes << 4);
          if (0 < lVar6) {
            lVar7 = 0;
            lVar6 = 0;
            do {
              iVar4 = dlb_fread((void *)((long)&(local_60.opcodes)->opcode + lVar7),1,4,dp);
              if (iVar4 != 4) goto LAB_0024c364;
              uVar2 = *(uint *)((long)&(local_60.opcodes)->opcode + lVar7);
              if (0x4b < uVar2) {
                panic("sp_level_loader: impossible opcode %i.");
              }
              if (uVar2 == 0x28) {
                buf = (byte *)malloc(0x10);
                *buf = 0;
                buf[8] = 0;
                buf[9] = 0;
                buf[10] = 0;
                buf[0xb] = 0;
                buf[0xc] = 0;
                buf[0xd] = 0;
                buf[0xe] = 0;
                buf[0xf] = 0;
                iVar4 = dlb_fread(buf,1,1,dp);
                if (iVar4 != 1) goto LAB_0024c364;
                bVar1 = *buf;
                if (9 < bVar1) {
                  panic("sp_level_loader: Unknown opcode %i",0x28);
                }
                if ((0x1f2U >> (bVar1 & 0x1f) & 1) == 0) {
                  if ((0x20cU >> (bVar1 & 0x1f) & 1) != 0) {
                    iVar5 = dlb_fread(&local_64,1,4,dp);
                    iVar4 = local_64;
                    if (iVar5 != 4) goto LAB_0024c364;
                    lVar8 = (long)local_64;
                    buf_00 = malloc(lVar8 + 1);
                    if (lVar8 == 0) {
                      iVar4 = 0;
                    }
                    else {
                      local_50 = buf_00;
                      iVar4 = dlb_fread(buf_00,1,iVar4,dp);
                      buf_00 = local_50;
                      if (iVar4 != local_64) goto LAB_0024c364;
                    }
                    *(undefined1 *)((long)buf_00 + (long)iVar4) = 0;
                    *(void **)(buf + 8) = buf_00;
                  }
                }
                else {
                  iVar4 = dlb_fread(buf + 8,1,8,dp);
                  if (iVar4 != 8) goto LAB_0024c364;
                }
              }
              else {
                buf = (byte *)0x0;
              }
              *(byte **)((long)&(local_60.opcodes)->opdat + lVar7) = buf;
              lVar6 = lVar6 + 1;
              lVar7 = lVar7 + 0x10;
            } while (lVar6 < local_60.n_opcodes);
          }
          sp_level_coder(local_48,&local_60);
          bVar3 = '\x01';
        }
        else {
LAB_0024c364:
          load_special_cold_2();
          bVar3 = '\0';
        }
        if (0 < local_60.n_opcodes) {
          lVar6 = 8;
          lVar7 = 0;
          do {
            ov = *(opvar **)((long)&(local_60.opcodes)->opcode + lVar6);
            if (0x4b < *(uint *)((long)local_60.opcodes + lVar6 + -8)) {
              panic("sp_level_free: unknown opcode %i");
            }
            if (ov != (opvar *)0x0) {
              opvar_free_x(ov);
            }
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x10;
          } while (lVar7 < local_60.n_opcodes);
        }
        free(local_60.opcodes);
      }
      dlb_fclose(dp);
      return bVar3;
    }
    load_special_cold_1();
  }
  return '\0';
}

Assistant:

boolean load_special(struct level *lev, const char *name)
{
	dlb *fd;
	sp_lev lvl;
	boolean result = FALSE;
	struct version_info vers_info;

	fd = dlb_fopen(name, RDBMODE);
	if (!fd) return FALSE;

	Fread(&vers_info, sizeof vers_info, 1, fd);
	if (!check_version(&vers_info, name, TRUE))
	    goto give_up;

	result = sp_level_loader(lev, fd, &lvl);
	if (result) result = sp_level_coder(lev, &lvl);
	sp_level_free(&lvl);
give_up:
	dlb_fclose(fd);
	return result;

err_out:
	fprintf(stderr, "read error in load_special\n");
	return FALSE;
}